

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Sfm_DecPrint(Sfm_Dec_t *p,word (*Masks) [8])

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  ulong local_60;
  
  local_60 = 0;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    uVar1 = p->iTarget;
    lVar11 = (long)(int)uVar1;
    if ((lVar11 < 0) || ((p->vObjFanins).nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pcVar9 = "OFF";
    if (bVar3) {
      pcVar9 = "ON";
    }
    if ((p->vObjGates).nSize <= (int)uVar1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar7 = (p->vObjGates).pArray[lVar11];
    if (((long)iVar7 < 0) || ((p->vGateHands).nSize <= iVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pVVar2 = (p->vObjFanins).pArray;
    uVar5 = p->nDivs;
    pcVar6 = Mio_GateReadName((Mio_Gate_t *)(p->vGateHands).pArray[iVar7]);
    printf("%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ",pcVar9,(ulong)uVar1,
           (ulong)uVar5,pcVar6);
    if (0 < pVVar2[lVar11].nSize) {
      lVar8 = 0;
      do {
        printf("%d ");
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar2[lVar11].nSize);
    }
    putchar(10);
    printf("Implications: ");
    if (0 < p->vImpls[local_60].nSize) {
      lVar11 = 0;
      do {
        uVar1 = p->vImpls[local_60].pArray[lVar11];
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        pcVar9 = "!";
        if ((uVar1 & 1) == 0) {
          pcVar9 = "";
        }
        uVar5 = Sfm_DecFindCost(p,(int)local_60,uVar1,Masks[local_60 ^ 1]);
        printf("%s%d(%d) ",pcVar9,(ulong)(uVar1 >> 1),(ulong)uVar5);
        lVar11 = lVar11 + 1;
      } while (lVar11 < p->vImpls[local_60].nSize);
    }
    putchar(10);
    printf("     ");
    if (0 < p->nDivs) {
      iVar7 = 0;
      do {
        printf("%d");
        iVar7 = iVar7 + 1;
      } while (iVar7 < p->nDivs);
    }
    putchar(10);
    printf("     ");
    if (0 < p->nDivs) {
      iVar7 = 0;
      do {
        printf("%d");
        iVar7 = iVar7 + 1;
      } while (iVar7 < p->nDivs);
    }
    putchar(10);
    if (0 < p->nPats[local_60]) {
      uVar10 = 0;
      do {
        printf("%2d : ");
        if (0 < p->nDivs) {
          lVar11 = 0;
          lVar8 = 0;
          do {
            if (p->vSets[local_60].nSize <= lVar11) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            printf("%d",(ulong)((*(ulong *)((long)p->vSets[local_60].pArray +
                                           lVar11 * 8 + (uVar10 >> 3 & 0xfffffffffffffff8)) >>
                                 ((uint)uVar10 & 0x3f) & 1) != 0));
            lVar8 = lVar8 + 1;
            lVar11 = lVar11 + 8;
          } while (lVar8 < p->nDivs);
        }
        putchar(10);
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < p->nPats[local_60]);
    }
    local_60 = 1;
    bVar4 = false;
  } while (bVar3);
  return;
}

Assistant:

void Sfm_DecPrint( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS] )
{
    int c, i, k, Entry;
    for ( c = 0; c < 2; c++ )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( &p->vObjFanins, p->iTarget );
        printf( "%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ", 
            c ? "OFF": "ON", p->iTarget, p->nDivs, 
            Mio_GateReadName((Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands, Vec_IntEntry(&p->vObjGates,p->iTarget))) );
        Vec_IntForEachEntry( vLevel, Entry, i )
            printf( "%d ", Entry );
        printf( "\n" );

        printf( "Implications: " );
        Vec_IntForEachEntry( &p->vImpls[c], Entry, i )
            printf( "%s%d(%d) ", Abc_LitIsCompl(Entry)? "!":"", Abc_Lit2Var(Entry), Sfm_DecFindCost(p, c, Entry, Masks[!c]) );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", (i / 10) % 10 );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
        for ( k = 0; k < p->nPats[c]; k++ )
        {
            printf( "%2d : ", k );
            for ( i = 0; i < p->nDivs; i++ )
                printf( "%d", Abc_TtGetBit(Sfm_DecDivPats(p, i, c), k) );
            printf( "\n" );
        }
        //printf( "\n" );
    }
}